

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

bool __thiscall QTimeZone::hasTransitions(QTimeZone *this)

{
  long lVar1;
  bool bVar2;
  TimeSpec TVar3;
  int iVar4;
  QTimeZonePrivate *pQVar5;
  ShortData *in_RDI;
  long in_FS_OFFSET;
  QTimeZone *in_stack_ffffffffffffffb8;
  QTimeZone *in_stack_ffffffffffffffd8;
  bool local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Data::isShort((Data *)in_RDI);
  if (bVar2) {
    TVar3 = ShortData::spec(in_RDI);
    if (TVar3 == LocalTime) {
      systemTimeZone();
      local_11 = hasTransitions(in_stack_ffffffffffffffd8);
      ~QTimeZone((QTimeZone *)0x5812d4);
      goto LAB_00581334;
    }
    if (TVar3 - UTC < 2) {
      local_11 = false;
      goto LAB_00581334;
    }
  }
  else {
    bVar2 = isValid(in_stack_ffffffffffffffb8);
    if (bVar2) {
      pQVar5 = Data::operator->((Data *)in_RDI);
      iVar4 = (*pQVar5->_vptr_QTimeZonePrivate[0x10])();
      local_11 = (bool)((byte)iVar4 & 1);
      goto LAB_00581334;
    }
  }
  local_11 = false;
LAB_00581334:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QTimeZone::hasTransitions() const
{
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().hasTransitions();
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            return false;
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (isValid()) {
        return d->hasTransitions();
    }
    return false;
}